

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O2

void __thiscall despot::BaseRockSample::Init_5_5(BaseRockSample *this)

{
  ostream *poVar1;
  int *piVar2;
  int i;
  long lVar3;
  Coord *this_00;
  int local_60;
  undefined4 uStack_5c;
  Coord local_58 [8];
  Coord local_50 [8];
  Coord local_48 [8];
  Coord local_40 [8];
  Coord local_38 [8];
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Using special layout for rocksample(5, 5)");
  std::endl<char,std::char_traits<char>>(poVar1);
  this_00 = local_58;
  despot::Coord::Coord(this_00,2,4);
  despot::Coord::Coord(local_50,0,4);
  despot::Coord::Coord(local_48,3,3);
  despot::Coord::Coord(local_40,2,2);
  despot::Coord::Coord(local_38,4,1);
  despot::Coord::Coord((Coord *)&local_60,0,2);
  *(ulong *)&this->start_pos_ = CONCAT44(uStack_5c,local_60);
  local_60 = -1;
  Grid<int>::SetAllValues(&this->grid_,&local_60);
  for (lVar3 = 0; lVar3 < this->num_rocks_; lVar3 = lVar3 + 1) {
    piVar2 = Grid<int>::operator()(&this->grid_,this_00);
    *piVar2 = (int)lVar3;
    std::vector<despot::Coord,_std::allocator<despot::Coord>_>::push_back(&this->rock_pos_,this_00);
    this_00 = this_00 + 8;
  }
  return;
}

Assistant:

void BaseRockSample::Init_5_5() {
	cout << "Using special layout for rocksample(5, 5)" << endl;

	Coord rocks[] = { Coord(2, 4), Coord(0, 4), Coord(3, 3), Coord(2, 2), Coord(
		4, 1) };

	start_pos_ = Coord(0, 2);
	grid_.SetAllValues(-1);
	for (int i = 0; i < num_rocks_; ++i) {
		grid_(rocks[i]) = i;
		rock_pos_.push_back(rocks[i]);
	}
}